

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O3

SQInteger __thiscall SQBlob::Seek(SQBlob *this,SQInteger offset,SQInteger origin)

{
  bool bVar1;
  
  if (origin == 0) {
    offset = offset + this->_ptr;
    bVar1 = this->_size < offset;
  }
  else {
    if (origin != 1) {
      if (origin != 2) {
        return -1;
      }
      if (offset < 0) {
        return -1;
      }
      if (this->_size < offset) {
        return -1;
      }
      goto LAB_001666ac;
    }
    bVar1 = 0 < offset;
    offset = offset + this->_size;
  }
  if (offset < 0 || bVar1) {
    return -1;
  }
LAB_001666ac:
  this->_ptr = offset;
  return 0;
}

Assistant:

SQInteger Seek(SQInteger offset, SQInteger origin) {
        switch(origin) {
            case SQ_SEEK_SET:
                if(offset > _size || offset < 0) return -1;
                _ptr = offset;
                break;
            case SQ_SEEK_CUR:
                if(_ptr + offset > _size || _ptr + offset < 0) return -1;
                _ptr += offset;
                break;
            case SQ_SEEK_END:
                if(_size + offset > _size || _size + offset < 0) return -1;
                _ptr = _size + offset;
                break;
            default: return -1;
        }
        return 0;
    }